

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * getgeneric(Table *t,TValue *key)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  undefined8 uVar3;
  ushort uVar4;
  uint uVar5;
  Node *pNVar6;
  long lVar7;
  char *__assertion;
  bool bVar8;
  undefined1 auVar9 [16];
  
  pNVar6 = mainposition(t,key);
  do {
    uVar2 = key->tt_;
    uVar5 = 0;
    if (uVar2 != (pNVar6->i_key).nk.tt_) goto LAB_0013ae40;
    uVar4 = uVar2 & 0x7f;
    if (0x12 < uVar4) {
      if (uVar4 < 0x16) {
        if (uVar4 != 0x13) {
          if (uVar4 != 0x14) goto switchD_0013ad82_default;
          if ((uVar2 & 0xf) != 4) {
            __assertion = "(((((((k1))->tt_)) & 0x0F)) == (4))";
LAB_0013aec4:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                          ,0x97,"int equalkey(const TValue *, const Node *)");
          }
          if ((((TString *)(key->value_).gc)->tt & 0xf) != 4) {
            __assertion = "(((((k1)->value_).gc)->tt) & 0x0F) == 4";
            goto LAB_0013aec4;
          }
          if (((*(TString **)&pNVar6->i_key)->tt & 0xf) != 4) {
            __assertion = "(((((n2)->i_key.nk.value_).gc)->tt) & 0x0F) == 4";
            goto LAB_0013aec4;
          }
          uVar5 = luaS_eqlngstr((TString *)(key->value_).gc,*(TString **)&pNVar6->i_key);
          goto LAB_0013ae40;
        }
        if (uVar2 != 0x13) {
          __assert_fail("((((k1))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x8e,"int equalkey(const TValue *, const Node *)");
        }
      }
      else {
        if (uVar4 != 0x16) {
          if (uVar4 != 0x46) goto switchD_0013ad82_default;
          goto switchD_0013ad82_caseD_2;
        }
        if (uVar2 != 0x16) {
          __assert_fail("((((k1))->tt_) == (((6) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x95,"int equalkey(const TValue *, const Node *)");
        }
      }
      goto LAB_0013ae34;
    }
    switch(uVar4) {
    case 0:
      uVar5 = 1;
      break;
    case 1:
      if (uVar2 != 1) {
        __assert_fail("((((k1))->tt_) == (1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x8c,"int equalkey(const TValue *, const Node *)");
      }
      bVar8 = (key->value_).b == *(int *)&pNVar6->i_key;
      goto LAB_0013ae3d;
    case 2:
switchD_0013ad82_caseD_2:
      if (uVar2 != 2) {
        __assert_fail("((((k1))->tt_) == (2))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x93,"int equalkey(const TValue *, const Node *)");
      }
      goto LAB_0013ae34;
    case 3:
      if (uVar2 != 3) {
        __assert_fail("((((k1))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x90,"int equalkey(const TValue *, const Node *)");
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (key->value_).i;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pNVar6->i_key).nk.value_.i;
      uVar3 = vcmpsd_avx512f(auVar9,auVar1,0);
      uVar5 = (uint)uVar3 & 1;
      break;
    default:
switchD_0013ad82_default:
      if (-1 < (short)uVar2) {
        __assert_fail("(((k1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x99,"int equalkey(const TValue *, const Node *)");
      }
LAB_0013ae34:
      bVar8 = (key->value_).gc == (pNVar6->i_key).nk.value_.gc;
LAB_0013ae3d:
      uVar5 = (uint)bVar8;
    }
LAB_0013ae40:
    if (uVar5 != 0) {
      return &pNVar6->i_val;
    }
    lVar7 = (long)(pNVar6->i_key).nk.next;
    pNVar6 = pNVar6 + lVar7;
    if (lVar7 == 0) {
      return &luaO_nilobject_;
    }
  } while( true );
}

Assistant:

static const TValue *getgeneric (Table *t, const TValue *key) {
  Node *n = mainposition(t, key);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (equalkey(key, n))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}